

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O3

MusInfo * GME_OpenSong(FileReader *reader,char *fmt)

{
  int iVar1;
  int iVar2;
  gme_type_t type;
  Music_Emu *me;
  void *data;
  undefined4 extraout_var;
  gme_err_t pcVar3;
  GMESong *this;
  ulong size;
  float extraout_XMM0_Da;
  
  type = gme_identify_extension(fmt);
  if (type != (gme_type_t)0x0) {
    (*GSnd->_vptr_SoundRenderer[10])();
    me = gme_new_emu(type,(int)extraout_XMM0_Da);
    if (me != (Music_Emu *)0x0) {
      iVar1 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[3])(reader);
      size = (ulong)(int)reader->Length;
      data = operator_new__(size);
      iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,data,size);
      if (CONCAT44(extraout_var,iVar2) == size) {
        pcVar3 = gme_load_data(me,data,size);
        operator_delete__(data);
        if (pcVar3 == (gme_err_t)0x0) {
          this = (GMESong *)operator_new(0x38);
          GMESong::GMESong(this,me,(int)extraout_XMM0_Da);
          return (MusInfo *)this;
        }
        Printf("Failed loading song: %s\n",pcVar3);
      }
      else {
        operator_delete__(data);
      }
      gme_delete(me);
      (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,(long)iVar1,0);
      return (MusInfo *)0x0;
    }
  }
  return (MusInfo *)0x0;
}

Assistant:

MusInfo *GME_OpenSong(FileReader &reader, const char *fmt)
{
	gme_type_t type;
	gme_err_t err;
	BYTE *song;
	Music_Emu *emu;
	int sample_rate;
	
	type = gme_identify_extension(fmt);
	if (type == NULL)
	{
		return NULL;
	}
	sample_rate = (int)GSnd->GetOutputRate();
	emu = gme_new_emu(type, sample_rate);
	if (emu == NULL)
	{
		return NULL;
	}

    int fpos = reader.Tell();
    int len = reader.GetLength();
    song = new BYTE[len];
    if (reader.Read(song, len) != len)
    {
        delete[] song;
        gme_delete(emu);
        reader.Seek(fpos, SEEK_SET);
        return NULL;
    }

	err = gme_load_data(emu, song, len);
    delete[] song;

	if (err != NULL)
	{
		Printf("Failed loading song: %s\n", err);
		gme_delete(emu);
        reader.Seek(fpos, SEEK_SET);
		return NULL;
	}
	return new GMESong(emu, sample_rate);
}